

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_scale(ggml_compute_params *params,ggml_tensor *dst)

{
  float v;
  int iVar1;
  ggml_tensor *pgVar2;
  int64_t iVar3;
  size_t sVar4;
  size_t sVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  void *pvVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  int n;
  
  pgVar2 = dst->src[0];
  if (pgVar2->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0xf35,"fatal error");
  }
  cVar6 = ggml_is_contiguous(pgVar2);
  if (cVar6 == '\0') {
    pcVar9 = "ggml_is_contiguous(src0)";
    uVar12 = 0xf06;
  }
  else {
    cVar6 = ggml_is_contiguous(dst);
    if (cVar6 == '\0') {
      pcVar9 = "ggml_is_contiguous(dst)";
      uVar12 = 0xf07;
    }
    else {
      cVar6 = ggml_are_same_shape(pgVar2,dst);
      if (cVar6 != '\0') {
        v = (float)dst->op_params[0];
        iVar1 = params->ith;
        iVar8 = params->nth;
        iVar3 = pgVar2->ne[0];
        iVar7 = ggml_nrows(pgVar2);
        iVar8 = (iVar8 + -1 + iVar7) / iVar8;
        sVar4 = pgVar2->nb[1];
        sVar5 = dst->nb[1];
        n = (int)iVar3;
        lVar13 = (long)iVar1 * (long)iVar8;
        iVar8 = iVar8 + (int)lVar13;
        if (iVar7 <= iVar8) {
          iVar8 = iVar7;
        }
        lVar10 = sVar4 * lVar13;
        lVar14 = sVar5 * lVar13;
        for (; lVar13 < iVar8; lVar13 = lVar13 + 1) {
          pvVar11 = dst->data;
          if (pvVar11 != pgVar2->data) {
            memcpy((void *)((long)pvVar11 + lVar14),(void *)((long)pgVar2->data + lVar10),
                   (long)n << 2);
            pvVar11 = dst->data;
          }
          ggml_vec_scale_f32(n,(float *)((long)pvVar11 + lVar14),v);
          lVar10 = lVar10 + sVar4;
          lVar14 = lVar14 + sVar5;
        }
        return;
      }
      pcVar9 = "ggml_are_same_shape(src0, dst)";
      uVar12 = 0xf08;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar12,"GGML_ASSERT(%s) failed",pcVar9);
}

Assistant:

void ggml_compute_forward_scale(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_scale_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}